

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  bool bVar1;
  DInterpolation *pDVar2;
  size_t len;
  DSectorPlaneInterpolation *local_28;
  DInterpolation *interp;
  bool attach_local;
  int position_local;
  sector_t_conflict *this_local;
  
  len = 0;
  bVar1 = TObjPtr<DInterpolation>::operator==
                    ((TObjPtr<DInterpolation> *)(this->terrainnum + (long)position * 2 + 8),
                     (DInterpolation *)0x0);
  if (bVar1) {
    switch(position) {
    case 0:
      local_28 = (DSectorPlaneInterpolation *)DObject::operator_new((DObject *)0x80,len);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (local_28,(sector_t_conflict *)this,true,attach);
      break;
    case 1:
      local_28 = (DSectorPlaneInterpolation *)DObject::operator_new((DObject *)0x80,len);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (local_28,(sector_t_conflict *)this,false,attach);
      break;
    case 2:
      local_28 = (DSectorPlaneInterpolation *)DObject::operator_new((DObject *)0x70,len);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)local_28,(sector_t_conflict *)this,true);
      break;
    case 3:
      local_28 = (DSectorPlaneInterpolation *)DObject::operator_new((DObject *)0x70,len);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)local_28,(sector_t_conflict *)this,false);
      break;
    default:
      return (DInterpolation *)0x0;
    }
    TObjPtr<DInterpolation>::operator=
              ((TObjPtr<DInterpolation> *)(this->terrainnum + (long)position * 2 + 8),
               &local_28->super_DInterpolation);
  }
  pDVar2 = TObjPtr<DInterpolation>::operator->
                     ((TObjPtr<DInterpolation> *)(this->terrainnum + (long)position * 2 + 8));
  DInterpolation::AddRef(pDVar2);
  pDVar2 = ::TObjPtr::operator_cast_to_DInterpolation_
                     ((TObjPtr *)(this->terrainnum + (long)position * 2 + 8));
  GC::WriteBarrier(&pDVar2->super_DObject);
  pDVar2 = ::TObjPtr::operator_cast_to_DInterpolation_
                     ((TObjPtr *)(this->terrainnum + (long)position * 2 + 8));
  return pDVar2;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}